

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void asl::Random::getBytes(void *buffer,int n)

{
  ulong uVar1;
  ulong uVar2;
  FILE *__stream;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  Random local_48;
  
  __stream = fopen("/dev/urandom","rb");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(buffer,1,(long)n,__stream);
    fclose(__stream);
    if ((int)sVar3 == n) {
      return;
    }
  }
  Random(&local_48,true,true);
  if (0 < n) {
    uVar4 = 0;
    do {
      uVar2 = local_48._state[1] * 5;
      uVar1 = local_48._state[1] * 0x280;
      local_48._state[2] = local_48._state[2] ^ local_48._state[0];
      local_48._state[3] = local_48._state[3] ^ local_48._state[1];
      local_48._state[0] = local_48._state[0] ^ local_48._state[3];
      local_48._state[3] = local_48._state[3] << 0x2d | local_48._state[3] >> 0x13;
      uVar5 = local_48._state[1] << 0x11;
      local_48._state[1] = local_48._state[1] ^ local_48._state[2];
      local_48._state[2] = local_48._state[2] ^ uVar5;
      *(char *)((long)buffer + uVar4) =
           (char)(int)((double)((uVar1 | uVar2 >> 0x39) * 9 >> 0xb) * 2.842170943040401e-14);
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return;
}

Assistant:

void Random::getBytes(void* buffer, int n)
{
#ifdef _WIN32
	HCRYPTPROV cp = 0;
	if (CryptAcquireContextW(&cp, NULL, NULL, PROV_RSA_FULL, 0))
	{
		if (CryptGenRandom(cp, n, (BYTE*)buffer))
		{
			CryptReleaseContext(cp, 0);
			return;
		}
	}
#else
	FILE* f = fopen("/dev/urandom", "rb");
	if (f)
	{
		if((int)fread(buffer, 1, n, f) == n) {
			fclose(f);
			return;
		}
		fclose(f);
	}
#endif
	Random random;
	for(int i=0; i<n; i++)
		((byte*)buffer)[i] = (byte)random(255);
}